

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int dorevert(void)

{
  undo_rec *rec;
  undo_rec *puVar1;
  undo_rec **ppuVar2;
  anon_struct_16_2_4dd83919_for_next *paVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *fmt;
  buffer *pbVar7;
  
  iVar4 = access(curbp->b_fname,4);
  pbVar7 = curbp;
  if (iVar4 == 0) {
    iVar4 = curwp->w_dotline;
    curbp->b_flag = curbp->b_flag & 0xfe;
    while (rec = (pbVar7->b_undo).tqh_first, rec != (undo_rec *)0x0) {
      puVar1 = (rec->next).tqe_next;
      ppuVar2 = (rec->next).tqe_prev;
      paVar3 = &puVar1->next;
      if (puVar1 == (undo_rec *)0x0) {
        paVar3 = (anon_struct_16_2_4dd83919_for_next *)&pbVar7->b_undo;
      }
      paVar3->tqe_prev = ppuVar2;
      *ppuVar2 = puVar1;
      free_undo_record(rec);
      pbVar7 = curbp;
    }
    iVar5 = readin(pbVar7->b_fname);
    if (iVar5 != 0) {
      iVar4 = setlineno(iVar4);
      return iVar4;
    }
  }
  else {
    dobeep();
    piVar6 = __errno_location();
    if (*piVar6 == 2) {
      fmt = "File %s no longer exists!";
    }
    else {
      fmt = "File %s is no longer readable!";
    }
    ewprintf(fmt,curbp->b_fname);
  }
  return 0;
}

Assistant:

int
dorevert(void)
{
	int lineno;
	struct undo_rec *rec;

	if (access(curbp->b_fname, F_OK|R_OK) != 0) {
		dobeep();
		if (errno == ENOENT)
			ewprintf("File %s no longer exists!",
			    curbp->b_fname);
		else
			ewprintf("File %s is no longer readable!",
			    curbp->b_fname);
		return (FALSE);
	}

	/* Save our current line, so we can go back after reloading. */
	lineno = curwp->w_dotline;

	/* Prevent readin from asking if we want to kill the buffer. */
	curbp->b_flag &= ~BFCHG;

	/* Clean up undo memory */
	while ((rec = TAILQ_FIRST(&curbp->b_undo))) {
		TAILQ_REMOVE(&curbp->b_undo, rec, next);
		free_undo_record(rec);
	}

	if (readin(curbp->b_fname))
		return(setlineno(lineno));
	return (FALSE);
}